

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferOperations.cpp
# Opt level: O2

string * __thiscall
glcts::TextureBufferOperationsViaSSBOWrites::getSSBOComputeShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TextureBufferOperationsViaSSBOWrites *this)

{
  ostream *poVar1;
  stringstream strstream;
  stringstream asStack_198 [16];
  ostream local_188;
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(&local_188,
                           "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n\nprecision highp float;\n\nbuffer ComputeSSBO\n{\n    ivec4 value[];\n} computeSSBO;\n\nlayout (local_size_x = "
                          );
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(this->super_TextureBufferOperations).m_n_vectors_in_buffer_texture);
  std::operator<<(poVar1,
                  " ) in;\n\nvoid main(void)\n{\n    computeSSBO.value[gl_LocalInvocationID.x] = ivec4(gl_LocalInvocationID.x);\n}\n"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string TextureBufferOperationsViaSSBOWrites::getSSBOComputeShaderCode() const
{
	std::stringstream strstream;

	strstream << "${VERSION}\n"
				 "\n"
				 "${TEXTURE_BUFFER_REQUIRE}\n"
				 "\n"
				 "precision highp float;\n"
				 "\n"
				 "buffer ComputeSSBO\n"
				 "{\n"
				 "    ivec4 value[];\n"
				 "} computeSSBO;\n"
				 "\n"
				 "layout (local_size_x = "
			  << m_n_vectors_in_buffer_texture
			  << " ) in;\n"
				 "\n"
				 "void main(void)\n"
				 "{\n"
				 "    computeSSBO.value[gl_LocalInvocationID.x] = ivec4(gl_LocalInvocationID.x);\n"
				 "}\n";

	return strstream.str();
}